

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_filter_block_plane_horz_opt
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,
               int num_mis_in_lpf_unit_height_log2)

{
  loop_filter_info_n *lfi_n;
  BLOCK_SIZE BVar1;
  int dst_stride;
  uint8_t *puVar2;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO **ppMVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  MB_MODE_INFO *pMVar14;
  uint8_t *dst;
  byte bVar15;
  uint32_t uVar16;
  uint uVar17;
  int iVar19;
  AV1_DEBLOCKING_PARAMETERS *pAVar20;
  byte *pbVar21;
  int y;
  byte bVar22;
  char cVar23;
  USE_FILTER_TYPE use_filter_type;
  ulong uVar18;
  
  puVar2 = (plane_ptr->dst).buf;
  dst_stride = (plane_ptr->dst).stride;
  iVar13 = ((plane_ptr->dst).height + 3 >> 2) - mi_row;
  iVar19 = 1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  if (iVar13 < iVar19) {
    iVar19 = iVar13;
  }
  iVar9 = ((plane_ptr->dst).width + 3 >> 2) - mi_col;
  iVar13 = 0x20;
  if (iVar9 < 0x20) {
    iVar13 = iVar9;
  }
  lVar11 = (long)(cm->mi_params).mi_stride;
  lfi_n = &cm->lf_info;
  uVar12 = 0;
  do {
    if (iVar13 <= (int)uVar12) {
      return;
    }
    uVar17 = uVar12 + mi_col;
    uVar18 = (ulong)uVar17;
    params_buf->filter_length = '\0';
    ppMVar4 = (cm->mi_params).mi_grid_base + (cm->mi_params).mi_stride * mi_row + uVar18;
    pMVar3 = *ppMVar4;
    cVar23 = (char)*(ushort *)&pMVar3->field_0xa7;
    if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0)) {
      bVar22 = pMVar3->tx_size;
      if (((cVar23 < '\0') || ('\0' < pMVar3->ref_frame[0])) && (pMVar3->skip_txfm == '\0')) {
        BVar1 = pMVar3->bsize;
        bVar22 = pMVar3->inter_tx_size
                 [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [BVar1] - 1 & uVar17) >>
                  (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                  (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [BVar1] - 1 & mi_row) >>
                   (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                  (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
      }
      if (mi_row != 0) {
        pMVar14 = ppMVar4[-lVar11];
        if (xd != (MACROBLOCKD *)0x0) goto LAB_003250d7;
        cVar6 = (char)*(undefined2 *)&pMVar14->field_0xa7;
LAB_00325119:
        bVar8 = pMVar14->tx_size;
        if (((cVar6 < '\0') || ('\0' < pMVar14->ref_frame[0])) && (pMVar14->skip_txfm == '\0')) {
          BVar1 = pMVar14->bsize;
          bVar8 = pMVar14->inter_tx_size
                  [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [BVar1] - 1 & uVar17) >>
                   (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                   (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar1] - 1 & mi_row - 1) >>
                    (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                   (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
        }
        goto LAB_00325190;
      }
      bVar15 = 0x80;
    }
    else if (mi_row == 0) {
      bVar15 = 0x80;
      bVar22 = 0;
    }
    else {
      pMVar14 = ppMVar4[-lVar11];
      bVar22 = 0;
LAB_003250d7:
      cVar6 = (char)*(ushort *)&pMVar14->field_0xa7;
      if (xd->lossless[*(ushort *)&pMVar14->field_0xa7 & 7] == 0) goto LAB_00325119;
      bVar8 = 0;
LAB_00325190:
      bVar15 = block_size_wide[pMVar14->bsize];
      bVar7 = get_filter_level(cm,lfi_n,1,0,pMVar3);
      if (bVar7 == 0) {
        bVar7 = get_filter_level(cm,lfi_n,1,0,pMVar14);
      }
      if (pMVar14 == pMVar3) {
        if (pMVar3->skip_txfm == '\0') {
          bVar5 = true;
        }
        else {
          if (cVar23 < '\0') goto LAB_0032524a;
          bVar5 = pMVar3->ref_frame[0] < '\x01';
        }
        if (!bVar5) goto LAB_0032524a;
      }
      if (bVar7 != 0) {
        params_buf->filter_length = (uint8_t)horz_filter_length_luma[bVar22][bVar8];
        params_buf->lfthr = lfi_n->lfthr + bVar7;
      }
    }
LAB_0032524a:
    bVar8 = block_size_wide[pMVar3->bsize];
    if (bVar15 < block_size_wide[pMVar3->bsize]) {
      bVar8 = bVar15;
    }
    *tx_buf = bVar22;
    pAVar20 = params_buf;
    pbVar21 = tx_buf;
    uVar16 = mi_row;
    while( true ) {
      iVar9 = tx_size_high_unit[bVar22];
      uVar16 = uVar16 + iVar9;
      if (iVar19 + mi_row <= uVar16) break;
      pAVar20 = pAVar20 + iVar9;
      pAVar20->filter_length = '\0';
      uVar10 = (cm->mi_params).mi_stride * uVar16;
      ppMVar4 = (cm->mi_params).mi_grid_base;
      pMVar3 = ppMVar4[uVar10 + uVar18];
      cVar23 = (char)*(ushort *)&pMVar3->field_0xa7;
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0)) {
        bVar15 = pMVar3->tx_size;
        if (((cVar23 < '\0') || ('\0' < pMVar3->ref_frame[0])) && (pMVar3->skip_txfm == '\0')) {
          BVar1 = pMVar3->bsize;
          bVar15 = pMVar3->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar1] - 1 & uVar17) >>
                    (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [BVar1] - 1 & uVar16) >>
                     (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
        }
      }
      else {
        bVar15 = 0;
      }
      pMVar14 = ppMVar4[(ulong)uVar10 + (uVar18 - lVar11)];
      bVar7 = get_filter_level(cm,lfi_n,1,0,pMVar3);
      if (bVar7 == 0) {
        bVar7 = get_filter_level(cm,lfi_n,1,0,pMVar14);
      }
      if (pMVar14 == pMVar3) {
        if (pMVar3->skip_txfm == '\0') {
          bVar5 = true;
LAB_00325402:
          if (bVar5) goto joined_r0x00325408;
        }
        else if (-1 < cVar23) {
          bVar5 = pMVar3->ref_frame[0] < '\x01';
          goto LAB_00325402;
        }
      }
      else {
joined_r0x00325408:
        if (bVar7 != 0) {
          pAVar20->filter_length = (uint8_t)horz_filter_length_luma[bVar15][bVar22];
          pAVar20->lfthr = lfi_n->lfthr + bVar7;
        }
      }
      pbVar21 = pbVar21 + iVar9;
      if (block_size_wide[pMVar3->bsize] <= bVar8) {
        bVar8 = block_size_wide[pMVar3->bsize];
      }
      *pbVar21 = bVar15;
      bVar22 = bVar15;
    }
    if ((((uVar12 & 3) != 0) || (uVar17 = uVar12 | 3, iVar13 <= (int)uVar17)) ||
       (use_filter_type = '\x02', bVar8 < 0x10)) {
      uVar17 = uVar12 + 1;
      use_filter_type = 7 < bVar8 && (int)uVar17 < iVar13;
      if (7 >= bVar8 || (int)uVar17 >= iVar13) {
        uVar17 = uVar12;
      }
    }
    dst = puVar2 + (int)(uVar12 << 2);
    pbVar21 = tx_buf;
    pAVar20 = params_buf;
    for (iVar9 = 0; iVar9 < iVar19; iVar9 = iVar9 + uVar12) {
      if (*pbVar21 == 0xff) {
        pAVar20->filter_length = '\0';
        *pbVar21 = 0;
      }
      filter_horz(dst,dst_stride,pAVar20,cm->seq_params,use_filter_type);
      uVar12 = tx_size_high_unit[*pbVar21];
      dst = dst + dst_stride * 4 * uVar12;
      pbVar21 = pbVar21 + uVar12;
      pAVar20 = pAVar20 + uVar12;
    }
    uVar12 = uVar17 + 1;
  } while( true );
}

Assistant:

void av1_filter_block_plane_horz_opt(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int num_mis_in_lpf_unit_height_log2) {
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int plane_mi_cols =
      CEIL_POWER_OF_TWO(plane_ptr->dst.width, MI_SIZE_LOG2);
  const int plane_mi_rows =
      CEIL_POWER_OF_TWO(plane_ptr->dst.height, MI_SIZE_LOG2);
  const int y_range = AOMMIN((int)(plane_mi_rows - mi_row),
                             (1 << num_mis_in_lpf_unit_height_log2));
  const int x_range = AOMMIN((int)(plane_mi_cols - mi_col), MAX_MIB_SIZE);

  const ptrdiff_t mode_step = cm->mi_params.mi_stride;
  for (int x = 0; x < x_range; x++) {
    const uint32_t curr_x = mi_col + x;
    const uint32_t y_start = mi_row;
    const uint32_t y_end = mi_row + y_range;
    int min_block_width = block_size_high[BLOCK_128X128];
    set_lpf_parameters_for_line_luma(params_buf, tx_buf, cm, xd, HORZ_EDGE,
                                     curr_x, y_start, plane_ptr, y_end,
                                     mode_step, &min_block_width);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE filter_type = USE_SINGLE;

    uint8_t *p = dst_ptr + x * MI_SIZE;

    if ((x & 3) == 0 && (x + 3) < x_range && min_block_width >= 16) {
      // If we are on a col which is a multiple of 4, and the minimum width is
      // 16 pixels, then the current and right 3 cols must contain the same
      // prediction block. This is because dim 16 can only happen every unit of
      // 4 mi's.
      filter_type = USE_QUAD;
      x += 3;
    } else if ((x + 1) < x_range && min_block_width >= 8) {
      filter_type = USE_DUAL;
      x += 1;
    }

    for (int y = 0; y < y_range;) {
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      filter_horz(p, dst_stride, params, cm->seq_params, filter_type);

      // advance the destination pointer
      const uint32_t advance_units = tx_size_high_unit[*tx_size];
      y += advance_units;
      p += advance_units * dst_stride * MI_SIZE;
      params += advance_units;
      tx_size += advance_units;
    }
  }
}